

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

axbStatus_t op_vec_dot(axbVec_s *x,axbVec_s *y,axbScalar_s *dot,void *aux_data)

{
  size_t sVar1;
  double dVar2;
  
  dVar2 = 0.0;
  for (sVar1 = 0; y->size != sVar1; sVar1 = sVar1 + 1) {
    dVar2 = dVar2 + *(double *)((long)x->data + sVar1 * 8) * *(double *)((long)y->data + sVar1 * 8);
  }
  *(double *)dot->data = dVar2;
  return 0;
}

Assistant:

static axbStatus_t op_vec_dot(const struct axbVec_s *x, const struct axbVec_s *y, struct axbScalar_s *dot, void *aux_data)
{
  (void)aux_data;

  const double *d_x   = (const double*)x->data;
  const double *d_y   = (const double*)y->data;
        double *d_dot = (double*)dot->data;

  double d = 0;
  for (size_t i=0; i<y->size; ++i) d += d_x[i] * d_y[i];
  *d_dot = d;

  return 0;
}